

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O0

EStatusCodeAndObjectIDType __thiscall
PDFDocumentHandler::CopyObject(PDFDocumentHandler *this,ObjectIDType inSourceObjectID)

{
  bool bVar1;
  mapped_type *pmVar2;
  pointer ppVar3;
  EStatusCodeAndObjectIDType EVar4;
  undefined1 local_50 [8];
  ObjectIDTypeList anObjectList;
  _Self local_30;
  iterator it;
  ObjectIDType inSourceObjectID_local;
  PDFDocumentHandler *this_local;
  EStatusCodeAndObjectIDType result;
  
  it._M_node = (_Base_ptr)inSourceObjectID;
  std::pair<PDFHummus::EStatusCode,_unsigned_long>::
  pair<PDFHummus::EStatusCode,_unsigned_long,_true>
            ((pair<PDFHummus::EStatusCode,_unsigned_long> *)&this_local);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
       ::find(&this->mSourceToTarget,(key_type *)&it);
  anObjectList.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  _M_size = (size_t)std::
                    map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    ::end(&this->mSourceToTarget);
  bVar1 = std::operator==(&local_30,
                          (_Self *)&anObjectList.
                                    super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                    _M_impl._M_node._M_size);
  if (bVar1) {
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_50);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_50,
               (value_type_conflict *)&it);
    this_local._0_4_ = WriteNewObjects(this,(ObjectIDTypeList *)local_50);
    pmVar2 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](&this->mSourceToTarget,(key_type *)&it);
    result._0_8_ = *pmVar2;
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)local_50);
  }
  else {
    this_local._0_4_ = eSuccess;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                       (&local_30);
    result._0_8_ = ppVar3->second;
  }
  EVar4._4_4_ = 0;
  EVar4.first = (EStatusCode)this_local;
  EVar4.second = result._0_8_;
  return EVar4;
}

Assistant:

EStatusCodeAndObjectIDType PDFDocumentHandler::CopyObject(ObjectIDType inSourceObjectID)
{
	EStatusCodeAndObjectIDType result;

	ObjectIDTypeToObjectIDTypeMap::iterator it = mSourceToTarget.find(inSourceObjectID);
	if(it == mSourceToTarget.end())
	{
		ObjectIDTypeList anObjectList;
		anObjectList.push_back(inSourceObjectID);
		result.first = WriteNewObjects(anObjectList);
		result.second = mSourceToTarget[inSourceObjectID];
	}
	else
	{
		result.first = PDFHummus::eSuccess;
		result.second = it->second;
	}
	return result;
}